

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spriteview.cpp
# Opt level: O1

void __thiscall FSSSpriteView::setSprite(FSSSpriteView *this,PSprite *_sprite)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  char cVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  QPixmap pixmap;
  QSize size;
  undefined1 auStack_68 [24];
  int local_50;
  int iStack_4c;
  QSize local_48 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  FSSClickableLabel *local_30 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  (this->sprite).super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_sprite->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->sprite).super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(_sprite->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  QWidget::setBackgroundRole((ColorRole)this->labelImage);
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->labelImage,0));
  QLabel::setScaledContents(SUB81(this->labelImage,0));
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->labelImage,0));
  getPixmap((FSSSpriteView *)auStack_68);
  cVar2 = QPixmap::isNull();
  if (cVar2 == '\0') {
    uVar3 = QPixmap::size();
    dVar4 = (double)(int)uVar3 + (double)(int)uVar3;
    iStack_4c = (int)((ulong)uVar3 >> 0x20);
    dVar5 = (double)iStack_4c + (double)iStack_4c;
    iStack_4c = (int)((double)((ulong)dVar5 & 0x8000000000000000 | 0x3fe0000000000000) + dVar5);
    local_50 = (int)((double)((ulong)dVar4 & 0x8000000000000000 | 0x3fe0000000000000) + dVar4);
    QPixmap::scaled(local_48,(AspectRatioMode)auStack_68,(TransformationMode)&local_50);
    QPaintDevice::QPaintDevice((QPaintDevice *)local_30);
    _Var1._M_pi = local_38._M_pi;
    local_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_68._16_8_;
    local_30[0] = (FSSClickableLabel *)QFileInfo::fileName;
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    auStack_68._16_8_ = _Var1._M_pi;
    QPixmap::~QPixmap((QPixmap *)local_30);
    QPixmap::~QPixmap((QPixmap *)local_48);
    QWidget::resize((QSize *)this->labelImage);
  }
  else {
    local_30[0] = (FSSClickableLabel *)0xffffffffffffffff;
    QWidget::resize((QSize *)this->labelImage);
  }
  QLabel::setPixmap((QPixmap *)this->labelImage);
  QWidget::update();
  QPixmap::~QPixmap((QPixmap *)auStack_68);
  return;
}

Assistant:

void
FSSSpriteView::setSprite(Data::PSprite _sprite) {
  sprite = _sprite;

  labelImage->setBackgroundRole(QPalette::LinkVisited);
  labelImage->setSizePolicy(QSizePolicy::Ignored,
                            QSizePolicy::Ignored);
  labelImage->setScaledContents(false);
  labelImage->setSizePolicy(QSizePolicy::MinimumExpanding,
                            QSizePolicy::MinimumExpanding);
  QPixmap pixmap = getPixmap();
  if (pixmap.isNull()) {
    labelImage->resize(QSize());
  } else {
    QSize size = pixmap.size();
    size *= 2;
    pixmap = pixmap.scaled(size);
    labelImage->resize(size);
  }
  labelImage->setPixmap(pixmap);

  update();
}